

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path-util.cc
# Opt level: O2

bool tinyusdz::pathutil::ValidatePropPath(Path *path,string *err)

{
  bool bVar1;
  string *__lhs;
  allocator local_41;
  string local_40;
  
  __lhs = &path->_prop_part;
  bVar1 = ::std::operator==(__lhs,":");
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_40,":",&local_41);
    bVar1 = startsWith(__lhs,&local_40);
    ::std::__cxx11::string::_M_dispose();
    if (!bVar1) {
      ::std::__cxx11::string::string((string *)&local_40,":",&local_41);
      bVar1 = endsWith((string *)__lhs,(string *)&local_40);
      ::std::__cxx11::string::_M_dispose();
      if (!bVar1) {
        ::std::__cxx11::string::string((string *)&local_40,"::",&local_41);
        bVar1 = contains_str((string *)__lhs,(string *)&local_40);
        ::std::__cxx11::string::_M_dispose();
        if (!bVar1) {
          return true;
        }
      }
    }
  }
  if (err != (string *)0x0) {
    ::std::__cxx11::string::assign((char *)err);
  }
  return false;
}

Assistant:

bool ValidatePropPath(const Path &path, std::string *err) {
  if (path.prop_part() == ":") {
    if (err) {
      (*err) = "Proparty path is composed of namespace delimiter only(`:`).";
    }
    return false;
  }

  if (startsWith(path.prop_part(), ":")) {
    if (err) {
      (*err) = "Property path starts with namespace delimiter(`:`).";
    }
    return false;
  }

  if (endsWith(path.prop_part(), ":")) {
    if (err) {
      (*err) = "Property path ends with namespace delimiter(`:`).";
    }
    return false;
  }

  if (contains_str(path.prop_part(), "::")) {
    if (err) {
      (*err) = "Empty path among namespace delimiters(`::`) in Property path.";
    }
    return false;
  }

  // TODO: more validation

  return true;

}